

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lunasvg.cpp
# Opt level: O0

void __thiscall lunasvg::Element::render(Element *this,Bitmap *bitmap,Matrix *matrix)

{
  bool bVar1;
  SVGElement *pSVar2;
  shared_ptr<lunasvg::Canvas> local_a8 [2];
  Transform local_88;
  undefined1 local_70 [8];
  SVGRenderState state;
  shared_ptr<lunasvg::Canvas> canvas;
  Matrix *matrix_local;
  Bitmap *bitmap_local;
  Element *this_local;
  
  if (((this->super_Node).m_node != (SVGNode *)0x0) && (bVar1 = Bitmap::isNull(bitmap), !bVar1)) {
    Canvas::create((Canvas *)
                   &state.m_canvas.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,bitmap);
    Transform::Transform(&local_88,matrix);
    std::shared_ptr<lunasvg::Canvas>::shared_ptr
              (local_a8,(shared_ptr<lunasvg::Canvas> *)
                        &state.m_canvas.
                         super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    SVGRenderState::SVGRenderState
              ((SVGRenderState *)local_70,(SVGElement *)0x0,(SVGRenderState *)0x0,&local_88,Painting
               ,local_a8);
    std::shared_ptr<lunasvg::Canvas>::~shared_ptr(local_a8);
    pSVar2 = element(this,true);
    (*(pSVar2->super_SVGNode)._vptr_SVGNode[0x11])(pSVar2,local_70);
    SVGRenderState::~SVGRenderState((SVGRenderState *)local_70);
    std::shared_ptr<lunasvg::Canvas>::~shared_ptr
              ((shared_ptr<lunasvg::Canvas> *)
               &state.m_canvas.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return;
}

Assistant:

void Element::render(Bitmap& bitmap, const Matrix& matrix) const
{
    if(m_node == nullptr || bitmap.isNull())
        return;
    auto canvas = Canvas::create(bitmap);
    SVGRenderState state(nullptr, nullptr, matrix, SVGRenderMode::Painting, canvas);
    element(true)->render(state);
}